

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O0

bool __thiscall pstore::broker::gc_watch_thread::stop_vacuum(gc_watch_thread *this,string *path)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  not_null<const_char_*> local_58;
  quoted local_50;
  uint local_48;
  not_null<const_char_*> local_38;
  quoted local_30;
  maybe<int,_void> local_28;
  maybe<int,_void> pid;
  string *path_local;
  gc_watch_thread *this_local;
  
  pid = (maybe<int,_void>)path;
  get_pid(&local_28,this,path);
  bVar1 = pstore::maybe::operator_cast_to_bool((maybe *)&local_28);
  if (bVar1) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pstore::gsl::not_null<const_char_*>::not_null(&local_38,pcVar3);
    logger::quoted::quoted(&local_30,local_38);
    log<pstore::logger::quoted>(info,"Killing GC for ",local_30);
    piVar2 = maybe<int,_void>::operator*(&local_28);
    (*this->_vptr_gc_watch_thread[3])(this,piVar2);
    bimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::less<int>>::
    erasel<std::__cxx11::string>
              ((bimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::less<int>> *)
               &this->processes_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pid);
    this_local._7_1_ = 1;
  }
  local_48 = (uint)bVar1;
  maybe<int,_void>::~maybe(&local_28);
  if (local_48 == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pstore::gsl::not_null<const_char_*>::not_null(&local_58,pcVar3);
    logger::quoted::quoted(&local_50,local_58);
    log<pstore::logger::quoted>(info,"No GC process running for ",local_50);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool gc_watch_thread::stop_vacuum (std::string const & path) {
            if (maybe<process_identifier> const pid = this->get_pid (path)) {
                log (priority::info, "Killing GC for ", logger::quoted{path.c_str ()});
                this->kill (*pid);
                processes_.erasel (path);
                return true;
            }
            log (priority::info, "No GC process running for ", logger::quoted{path.c_str ()});
            return false;
        }